

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_impl.cc
# Opt level: O1

Status __thiscall
leveldb::DBImpl::RecoverLogFile
          (DBImpl *this,uint64_t log_number,bool last_log,bool *save_manifest,VersionEdit *edit,
          SequenceNumber *max_sequence)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  _func_int **pp_Var2;
  undefined8 mem;
  Version *base;
  bool bVar3;
  int iVar4;
  SequenceNumber SVar5;
  ulong uVar6;
  size_t sVar7;
  Writer *this_00;
  MemTable *this_01;
  undefined7 in_register_00000011;
  Cache *number;
  ulong *in_stack_00000008;
  uint64_t lfile_size;
  SequentialFile *file;
  Slice record;
  WriteBatch batch;
  string fname;
  string scratch;
  LogReporter reporter;
  Reader reader;
  VersionEdit *local_190;
  undefined1 local_188 [56];
  undefined8 local_150;
  InternalKeyComparator *local_148;
  VersionEdit *local_140;
  Version *local_138;
  SequentialFile *local_130;
  Cache *local_128;
  Slice local_120;
  undefined1 local_110 [48];
  char local_e0 [16];
  undefined1 local_d0 [32];
  Reporter local_b0 [3];
  char *local_98;
  DBImpl *local_90;
  Reader local_88;
  
  number = (Cache *)CONCAT71(in_register_00000011,last_log);
  local_188._44_4_ = SUB84(save_manifest,0);
  LogFileName((string *)(local_110 + 0x20),(string *)(log_number + 0x98),(uint64_t)number);
  (**(code **)(**(long **)(log_number + 8) + 0x10))
            (this,*(long **)(log_number + 8),(string *)(local_110 + 0x20),&local_130);
  if ((this->super_DB)._vptr_DB == (_func_int **)0x0) {
    local_b0[0]._vptr_Reporter = (_func_int **)&PTR__Reporter_00139020;
    local_b0[1]._vptr_Reporter = *(_func_int ***)(log_number + 8);
    local_b0[2]._vptr_Reporter = *(_func_int ***)(log_number + 0x48);
    local_98 = (char *)local_110._32_8_;
    local_90 = (DBImpl *)0x0;
    if (*(char *)(log_number + 0x3a) != '\0') {
      local_90 = this;
    }
    log::Reader::Reader(&local_88,local_130,local_b0,true,0);
    Log(*(Logger **)(log_number + 0x48),"Recovering log #%llu",number);
    local_d0._0_8_ = local_d0 + 0x10;
    local_d0._8_8_ = (FileLock *)0x0;
    local_d0[0x10] = '\0';
    local_120.data_ = "";
    local_188._24_8_ = (Comparator *)0x0;
    local_120.size_ = 0;
    local_140 = edit;
    local_138 = (Version *)max_sequence;
    local_128 = number;
    WriteBatch::WriteBatch((WriteBatch *)local_110);
    local_148 = (InternalKeyComparator *)(log_number + 0x10);
    local_190 = (VersionEdit *)0x0;
    local_188._32_8_ = log_number;
    do {
      while( true ) {
        bVar3 = log::Reader::ReadRecord(&local_88,&local_120,(string *)local_d0);
        sVar7 = local_120.size_;
        if (!bVar3 || (this->super_DB)._vptr_DB != (_func_int **)0x0) goto LAB_0010b565;
        if (0xb < local_120.size_) break;
        local_188._0_8_ = "log record too small";
        local_188._8_8_ = (Env *)0x14;
        local_188._48_8_ = "";
        local_150._0_1_ = false;
        local_150._1_1_ = false;
        local_150._2_1_ = false;
        local_150._3_5_ = 0;
        Status::Status((Status *)(local_188 + 0x10),kCorruption,(Slice *)local_188,
                       (Slice *)(local_188 + 0x30));
        RecoverLogFile(unsigned_long,bool,bool*,leveldb::VersionEdit*,unsigned_long*)::LogReporter::
        Corruption(unsigned_long,leveldb::Status_const__
                  (local_b0,sVar7,(Status *)(local_188 + 0x10));
        if ((_func_int **)local_188._16_8_ != (_func_int **)0x0) {
          operator_delete__((void *)local_188._16_8_);
        }
      }
      WriteBatchInternal::SetContents((WriteBatch *)local_110,&local_120);
      if (local_190 == (VersionEdit *)0x0) {
        local_190 = (VersionEdit *)operator_new(0x70);
        MemTable::MemTable((MemTable *)local_190,local_148);
        paVar1 = &(local_190->comparator_).field_2;
        *(int *)paVar1 = *(int *)paVar1 + 1;
      }
      WriteBatchInternal::InsertInto((WriteBatch *)local_188,(MemTable *)local_110);
      pp_Var2 = (this->super_DB)._vptr_DB;
      (this->super_DB)._vptr_DB = (_func_int **)local_188._0_8_;
      local_188._0_8_ = pp_Var2;
      if (pp_Var2 != (_func_int **)0x0) {
        operator_delete__(pp_Var2);
      }
      MaybeIgnoreError((DBImpl *)local_188._32_8_,(Status *)this);
      if ((this->super_DB)._vptr_DB != (_func_int **)0x0) break;
      SVar5 = WriteBatchInternal::Sequence((WriteBatch *)local_110);
      iVar4 = WriteBatchInternal::Count((WriteBatch *)local_110);
      uVar6 = ((long)iVar4 + SVar5) - 1;
      if (*in_stack_00000008 < uVar6) {
        *in_stack_00000008 = uVar6;
      }
      sVar7 = MemTable::ApproximateMemoryUsage((MemTable *)local_190);
      bVar3 = true;
      if (*(size_t *)(local_188._32_8_ + 0x50) < sVar7) {
        *(undefined1 *)&(local_140->comparator_)._M_dataplus._M_p = 1;
        WriteLevel0Table((DBImpl *)local_188,(MemTable *)local_188._32_8_,local_190,local_138);
        pp_Var2 = (this->super_DB)._vptr_DB;
        (this->super_DB)._vptr_DB = (_func_int **)local_188._0_8_;
        local_188._0_8_ = pp_Var2;
        if (pp_Var2 != (_func_int **)0x0) {
          operator_delete__(pp_Var2);
        }
        local_188._24_8_ = ZEXT48((int)local_188._24_8_ + 1);
        MemTable::Unref((MemTable *)local_190);
        bVar3 = (this->super_DB)._vptr_DB == (_func_int **)0x0;
        local_190 = (VersionEdit *)0x0;
      }
    } while (bVar3);
LAB_0010b565:
    base = local_138;
    if (local_130 != (SequentialFile *)0x0) {
      (*local_130->_vptr_SequentialFile[1])();
    }
    mem = local_188._32_8_;
    if (((this->super_DB)._vptr_DB == (_func_int **)0x0) &&
       (((byte)local_188._44_4_ & *(bool *)(local_188._32_8_ + 0x84) & local_188._24_4_ == 0) == 1))
    {
      if (*(WritableFile **)(local_188._32_8_ + 0x148) != (WritableFile *)0x0) {
        __assert_fail("logfile_ == nullptr",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/db_impl.cc"
                      ,0x1ca,
                      "Status leveldb::DBImpl::RecoverLogFile(uint64_t, bool, bool *, VersionEdit *, SequenceNumber *)"
                     );
      }
      if (*(Writer **)(local_188._32_8_ + 0x158) != (Writer *)0x0) {
        __assert_fail("log_ == nullptr",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/db_impl.cc"
                      ,0x1cb,
                      "Status leveldb::DBImpl::RecoverLogFile(uint64_t, bool, bool *, VersionEdit *, SequenceNumber *)"
                     );
      }
      if (*(MemTable **)(local_188._32_8_ + 0x130) != (MemTable *)0x0) {
        __assert_fail("mem_ == nullptr",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/db_impl.cc"
                      ,0x1cc,
                      "Status leveldb::DBImpl::RecoverLogFile(uint64_t, bool, bool *, VersionEdit *, SequenceNumber *)"
                     );
      }
      (*(*(Env **)(local_188._32_8_ + 8))->_vptr_Env[0xb])
                (local_188 + 0x30,*(Env **)(local_188._32_8_ + 8),local_110 + 0x20,local_188);
      if ((Comparator *)local_188._48_8_ == (Comparator *)0x0) {
        (*(*(Env **)(mem + 8))->_vptr_Env[5])
                  (local_188 + 0x10,*(Env **)(mem + 8),local_110 + 0x20,
                   (WritableFile **)(mem + 0x148));
        bVar3 = (_func_int **)local_188._16_8_ == (_func_int **)0x0;
        if ((_func_int **)local_188._16_8_ != (_func_int **)0x0) {
          operator_delete__((void *)local_188._16_8_);
        }
      }
      else {
        bVar3 = false;
      }
      if ((Comparator *)local_188._48_8_ != (Comparator *)0x0) {
        operator_delete__((void *)local_188._48_8_);
      }
      if (bVar3) {
        Log(*(Logger **)(mem + 0x48),"Reusing old log %s \n",local_110._32_8_);
        this_00 = (Writer *)operator_new(0x20);
        log::Writer::Writer(this_00,*(WritableFile **)(mem + 0x148),local_188._0_8_);
        *(Writer **)(mem + 0x158) = this_00;
        *(Cache **)(mem + 0x150) = local_128;
        if (local_190 == (VersionEdit *)0x0) {
          this_01 = (MemTable *)operator_new(0x70);
          MemTable::MemTable(this_01,local_148);
          *(MemTable **)(mem + 0x130) = this_01;
          this_01->refs_ = this_01->refs_ + 1;
        }
        else {
          *(VersionEdit **)(mem + 0x130) = local_190;
        }
        local_190 = (VersionEdit *)0x0;
      }
    }
    if (local_190 != (VersionEdit *)0x0) {
      if ((this->super_DB)._vptr_DB == (_func_int **)0x0) {
        *(undefined1 *)&(local_140->comparator_)._M_dataplus._M_p = 1;
        WriteLevel0Table((DBImpl *)local_188,(MemTable *)mem,local_190,base);
        pp_Var2 = (this->super_DB)._vptr_DB;
        (this->super_DB)._vptr_DB = (_func_int **)local_188._0_8_;
        local_188._0_8_ = pp_Var2;
        if (pp_Var2 != (_func_int **)0x0) {
          operator_delete__(pp_Var2);
        }
      }
      MemTable::Unref((MemTable *)local_190);
    }
    WriteBatch::~WriteBatch((WriteBatch *)local_110);
    if ((undefined1 *)local_d0._0_8_ != local_d0 + 0x10) {
      operator_delete((void *)local_d0._0_8_);
    }
    log::Reader::~Reader(&local_88);
    log::Reader::Reporter::~Reporter(local_b0);
  }
  else {
    MaybeIgnoreError((DBImpl *)log_number,(Status *)this);
  }
  if ((char *)local_110._32_8_ != local_e0) {
    operator_delete((void *)local_110._32_8_);
  }
  return (Status)(char *)this;
}

Assistant:

Status DBImpl::RecoverLogFile(uint64_t log_number, bool last_log,
                              bool* save_manifest, VersionEdit* edit,
                              SequenceNumber* max_sequence) {
  struct LogReporter : public log::Reader::Reporter {
    Env* env;
    Logger* info_log;
    const char* fname;
    Status* status;  // null if options_.paranoid_checks==false
    void Corruption(size_t bytes, const Status& s) override {
      Log(info_log, "%s%s: dropping %d bytes; %s",
          (this->status == nullptr ? "(ignoring error) " : ""), fname,
          static_cast<int>(bytes), s.ToString().c_str());
      if (this->status != nullptr && this->status->ok()) *this->status = s;
    }
  };

  mutex_.AssertHeld();

  // Open the log file
  std::string fname = LogFileName(dbname_, log_number);
  SequentialFile* file;
  Status status = env_->NewSequentialFile(fname, &file);
  if (!status.ok()) {
    MaybeIgnoreError(&status);
    return status;
  }

  // Create the log reader.
  LogReporter reporter;
  reporter.env = env_;
  reporter.info_log = options_.info_log;
  reporter.fname = fname.c_str();
  reporter.status = (options_.paranoid_checks ? &status : nullptr);
  // We intentionally make log::Reader do checksumming even if
  // paranoid_checks==false so that corruptions cause entire commits
  // to be skipped instead of propagating bad information (like overly
  // large sequence numbers).
  log::Reader reader(file, &reporter, true /*checksum*/, 0 /*initial_offset*/);
  Log(options_.info_log, "Recovering log #%llu",
      (unsigned long long)log_number);

  // Read all the records and add to a memtable
  std::string scratch;
  Slice record;
  WriteBatch batch;
  int compactions = 0;
  MemTable* mem = nullptr;
  while (reader.ReadRecord(&record, &scratch) && status.ok()) {
    if (record.size() < 12) {
      reporter.Corruption(record.size(),
                          Status::Corruption("log record too small"));
      continue;
    }
    WriteBatchInternal::SetContents(&batch, record);

    if (mem == nullptr) {
      mem = new MemTable(internal_comparator_);
      mem->Ref();
    }
    status = WriteBatchInternal::InsertInto(&batch, mem);
    MaybeIgnoreError(&status);
    if (!status.ok()) {
      break;
    }
    const SequenceNumber last_seq = WriteBatchInternal::Sequence(&batch) +
                                    WriteBatchInternal::Count(&batch) - 1;
    if (last_seq > *max_sequence) {
      *max_sequence = last_seq;
    }

    if (mem->ApproximateMemoryUsage() > options_.write_buffer_size) {
      compactions++;
      *save_manifest = true;
      status = WriteLevel0Table(mem, edit, nullptr);
      mem->Unref();
      mem = nullptr;
      if (!status.ok()) {
        // Reflect errors immediately so that conditions like full
        // file-systems cause the DB::Open() to fail.
        break;
      }
    }
  }

  delete file;

  // See if we should keep reusing the last log file.
  if (status.ok() && options_.reuse_logs && last_log && compactions == 0) {
    assert(logfile_ == nullptr);
    assert(log_ == nullptr);
    assert(mem_ == nullptr);
    uint64_t lfile_size;
    if (env_->GetFileSize(fname, &lfile_size).ok() &&
        env_->NewAppendableFile(fname, &logfile_).ok()) {
      Log(options_.info_log, "Reusing old log %s \n", fname.c_str());
      log_ = new log::Writer(logfile_, lfile_size);
      logfile_number_ = log_number;
      if (mem != nullptr) {
        mem_ = mem;
        mem = nullptr;
      } else {
        // mem can be nullptr if lognum exists but was empty.
        mem_ = new MemTable(internal_comparator_);
        mem_->Ref();
      }
    }
  }

  if (mem != nullptr) {
    // mem did not get reused; compact it.
    if (status.ok()) {
      *save_manifest = true;
      status = WriteLevel0Table(mem, edit, nullptr);
    }
    mem->Unref();
  }

  return status;
}